

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

Value * system_function_input(Value *context_value,TupleValue *parameter_values)

{
  char cVar1;
  int iVar2;
  Value *pVVar3;
  char *val;
  size_t sStack_186d0;
  char c;
  size_t buffer_length;
  char buffer [100000];
  StringValue *string_value;
  TupleValue *parameter_values_local;
  Value *context_value_local;
  
  if (parameter_values->length != 0) {
    pVVar3 = convert_to_string_value(*parameter_values->items);
    printf("%s",*(undefined8 *)(pVVar3 + 1));
    free_value(pVVar3);
  }
  sStack_186d0 = 0;
  while( true ) {
    iVar2 = getchar_unlocked();
    cVar1 = (char)iVar2;
    if ((cVar1 == -1) || (cVar1 == '\n')) break;
    if ('\x1f' < cVar1) {
      buffer[sStack_186d0 - 8] = cVar1;
      sStack_186d0 = sStack_186d0 + 1;
    }
  }
  val = create_string_from_buffer((char *)&buffer_length,sStack_186d0);
  pVVar3 = new_string_value(val,sStack_186d0);
  return pVVar3;
}

Assistant:

Value *system_function_input(Value *context_value, TupleValue *parameter_values) {
  if (parameter_values->length > 0) {
    StringValue *string_value = (StringValue *) convert_to_string_value(parameter_values->items[0]);

    printf("%s", string_value->string_value);

    free_value((Value *) string_value);
  }

  char buffer[BUFFER_SIZE];
  size_t buffer_length = 0;

  char c;

  while (true) {
    c = getchar_unlocked();

    if (c == EOF || c == '\n') break;
    else if (c < ' ') continue;

    buffer[buffer_length++] = c;
  }

  return new_string_value(create_string_from_buffer(buffer, buffer_length), buffer_length);
}